

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::ABY(m6502 *this)

{
  ushort uVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  uint16_t uVar4;
  undefined8 in_RCX;
  uint16_t hi;
  uint16_t lo;
  m6502 *this_local;
  size_t __nbytes;
  
  uVar1 = this->pc;
  uVar4 = uVar1 + 1;
  __nbytes = CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar4);
  this->pc = uVar4;
  sVar2 = read(this,(uint)uVar1,(void *)0x0,__nbytes);
  uVar1 = this->pc;
  uVar4 = uVar1 + 1;
  this->pc = uVar4;
  sVar3 = read(this,(uint)uVar1,(void *)0x0,CONCAT62((int6)(__nbytes >> 0x10),uVar4));
  this->addrAbs = ((ushort)(byte)sVar3 << 8 | (ushort)sVar2 & 0xff) + (ushort)this->y;
  return (uint16_t)(this->addrAbs & 0xff00) != (uint16_t)((ushort)(byte)sVar3 << 8);
}

Assistant:

uint8_t ABY()
  {
    uint16_t lo = read(pc++);
    uint16_t hi = read(pc++);
    addrAbs = ((hi << 8) | lo) + y;
    // if page changed, need an additional clock cycle
    if ((addrAbs & 0xFF00u) != (hi << 8))
    {
      return 1;
    }
    return 0;
  }